

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  undefined4 *puVar2;
  curl_slist *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  char *pcVar6;
  char *pcVar7;
  curl_off_t cVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  Curl_easy *data;
  Curl_easy *pCVar16;
  undefined8 *puVar17;
  char *address;
  hostname host;
  
  *done = false;
  pCVar16 = conn->data;
  pcVar6 = (pCVar16->set).str[6];
  if (pcVar6 != (char *)0x0) {
    CVar5 = Curl_urldecode(pCVar16,pcVar6,0,(char **)((long)(pCVar16->req).protop + 8),(size_t *)0x0
                           ,true);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    pCVar16 = conn->data;
  }
  (pCVar16->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar16,0);
  Curl_pgrsSetDownloadCounter(pCVar16,0);
  Curl_pgrsSetUploadSize(pCVar16,-1);
  Curl_pgrsSetDownloadSize(pCVar16,-1);
  pCVar16 = conn->data;
  puVar2 = (undefined4 *)(pCVar16->req).protop;
  if (((pCVar16->set).field_0x913 & 0x10) != 0) {
    *puVar2 = 1;
  }
  *done = false;
  pcVar3 = (pCVar16->set).mail_rcpt;
  *(curl_slist **)(puVar2 + 4) = pcVar3;
  *(undefined1 *)(puVar2 + 6) = 0;
  puVar2[7] = 0;
  *(undefined1 *)(puVar2 + 10) = 1;
  *(undefined8 *)(puVar2 + 8) = 2;
  if (((pCVar16->set).field_0x913 & 0x20) == 0) {
    if (pcVar3 == (curl_slist *)0x0 || (pCVar16->set).mimepost.kind == MIMEKIND_NONE) {
LAB_00134417:
      CVar5 = smtp_perform_command(conn);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      goto LAB_00134423;
    }
  }
  else if (pcVar3 == (curl_slist *)0x0) goto LAB_00134417;
  pcVar6 = (pCVar16->set).str[0x3b];
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (*Curl_cstrdup)("<>");
    bVar11 = false;
  }
  else {
    address = (char *)0x0;
    host.name = (char *)0x0;
    host.dispname = (char *)0x0;
    host.rawalloc = (char *)0x0;
    host.encalloc = (char *)0x0;
    CVar5 = smtp_parse_address(conn,pcVar6,&address,&host);
    pcVar9 = address;
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    if ((conn->proto).imapc.resptag[2] == '\0') {
      bVar11 = false;
    }
    else {
      bVar11 = true;
      if ((host.encalloc == (char *)0x0) && (_Var4 = Curl_is_ASCII_name(address), _Var4)) {
        _Var4 = Curl_is_ASCII_name(host.name);
        bVar11 = !_Var4;
      }
    }
    if (host.name == (char *)0x0) {
      pcVar6 = curl_maprintf("<%s>",pcVar9);
    }
    else {
      pcVar6 = curl_maprintf("<%s@%s>",pcVar9);
      Curl_free_idnconverted_hostname(&host);
    }
    (*Curl_cfree)(pcVar9);
  }
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar9 = (pCVar16->set).str[0x3c];
  if ((pcVar9 == (char *)0x0) || ((conn->proto).ftpc.cwdcount == 0)) {
    pcVar9 = (char *)0x0;
  }
  else {
    if (*pcVar9 == '\0') {
      pcVar9 = (*Curl_cstrdup)("<>");
    }
    else {
      address = (char *)0x0;
      host.name = (char *)0x0;
      host.dispname = (char *)0x0;
      host.rawalloc = (char *)0x0;
      host.encalloc = (char *)0x0;
      CVar5 = smtp_parse_address(conn,pcVar9,&address,&host);
      if (CVar5 != CURLE_OK) {
        (*Curl_cfree)(pcVar6);
        return CVar5;
      }
      if (((!bVar11) && ((conn->proto).imapc.resptag[2] == '\x01')) &&
         ((host.encalloc != (char *)0x0 ||
          ((_Var4 = Curl_is_ASCII_name(address), !_Var4 ||
           (_Var4 = Curl_is_ASCII_name(host.name), !_Var4)))))) {
        bVar11 = true;
      }
      pcVar7 = address;
      if (host.name != (char *)0x0) {
        (*Curl_cfree)(pcVar6);
        pcVar9 = address;
        pcVar6 = curl_maprintf("<%s@%s>",address,host.name);
        Curl_free_idnconverted_hostname(&host);
        (*Curl_cfree)(pcVar9);
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        goto LAB_001348f6;
      }
      pcVar9 = curl_maprintf("<%s>",address);
      (*Curl_cfree)(pcVar7);
    }
    if (pcVar9 == (char *)0x0) {
LAB_001348f6:
      (*Curl_cfree)(pcVar6);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((pCVar16->set).mimepost.kind != MIMEKIND_NONE) {
    part = &(pCVar16->set).mimepost;
    puVar1 = &(pCVar16->set).mimepost.flags;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
    curl_mime_headers(part,(pCVar16->set).headers,0);
    CVar5 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
    if ((CVar5 != CURLE_OK) ||
       (((pcVar7 = Curl_checkheaders(conn,"Mime-Version"), pcVar7 == (char *)0x0 &&
         (CVar5 = Curl_mime_add_header(&(pCVar16->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar5 != CURLE_OK)) || (CVar5 = Curl_mime_rewind(part), CVar5 != CURLE_OK)))) {
      (*Curl_cfree)(pcVar6);
      goto LAB_0013486c;
    }
    cVar8 = Curl_mime_size(part);
    (pCVar16->state).infilesize = cVar8;
    (pCVar16->state).fread_func = Curl_mime_read;
    (pCVar16->state).in = part;
  }
  if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (pCVar16->state).infilesize)) {
    pcVar7 = curl_maprintf("%ld");
    if (pcVar7 == (char *)0x0) {
      (*Curl_cfree)(pcVar6);
      CVar5 = CURLE_OUT_OF_MEMORY;
LAB_0013486c:
      (*Curl_cfree)(pcVar9);
      return CVar5;
    }
  }
  else {
    pcVar7 = (char *)0x0;
  }
  pcVar12 = pcVar9;
  pcVar15 = pcVar7;
  if ((conn->proto).imapc.resptag[2] == '\0') {
    pcVar10 = " AUTH=";
    if (pcVar9 == (char *)0x0) {
      pcVar10 = "";
      pcVar12 = "";
    }
    pcVar13 = " SIZE=";
    if (pcVar7 == (char *)0x0) {
      pcVar13 = "";
    }
LAB_001347d4:
    pcVar14 = "";
    if (pcVar7 == (char *)0x0) {
      pcVar15 = pcVar14;
    }
    if (bVar11) {
LAB_001347de:
      pcVar14 = " SMTPUTF8";
    }
  }
  else {
    if (bVar11) {
      pcVar10 = " AUTH=";
      if (pcVar9 == (char *)0x0) {
        pcVar10 = "";
        pcVar12 = "";
      }
      pcVar13 = " SIZE=";
      if (pcVar7 == (char *)0x0) {
        pcVar13 = "";
        pcVar15 = "";
      }
      goto LAB_001347de;
    }
    puVar17 = *(undefined8 **)((long)(pCVar16->req).protop + 0x10);
    if (puVar17 != (undefined8 *)0x0) {
      do {
        _Var4 = Curl_is_ASCII_name((char *)*puVar17);
        if (!_Var4) {
          bVar11 = true;
        }
        puVar17 = (undefined8 *)puVar17[1];
      } while ((puVar17 != (undefined8 *)0x0) && (!bVar11));
      pcVar10 = " AUTH=";
      if (pcVar9 == (char *)0x0) {
        pcVar10 = "";
        pcVar12 = "";
      }
      pcVar13 = " SIZE=";
      if (pcVar7 == (char *)0x0) {
        pcVar13 = "";
      }
      goto LAB_001347d4;
    }
    pcVar14 = "";
    pcVar10 = " AUTH=";
    if (pcVar9 == (char *)0x0) {
      pcVar10 = "";
      pcVar12 = "";
    }
    pcVar13 = " SIZE=";
    if (pcVar7 == (char *)0x0) {
      pcVar13 = "";
      pcVar15 = "";
    }
  }
  CVar5 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s%s%s%s%s%s",pcVar6,pcVar10,pcVar12,
                        pcVar13,pcVar15,pcVar14);
  (*Curl_cfree)(pcVar6);
  (*Curl_cfree)(pcVar9);
  (*Curl_cfree)(pcVar7);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  (conn->proto).imapc.state = IMAP_SELECT;
LAB_00134423:
  CVar5 = smtp_multi_statemach(conn,done);
  if (((CVar5 == CURLE_OK) && (CVar5 = CURLE_OK, *done == true)) && (*(conn->data->req).protop != 0)
     ) {
    CVar5 = CURLE_OK;
    Curl_setup_transfer(conn->data,-1,-1,false,-1);
  }
  return CVar5;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}